

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_array.h
# Opt level: O0

reference __thiscall
gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
          (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this,
          size_type_conflict n)

{
  ostream *poVar1;
  S2ClippedShape *pSVar2;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  size_type_conflict local_14;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *pcStack_10;
  size_type_conflict n_local;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_local;
  
  local_14 = n;
  pcStack_10 = this;
  if (n < (*(uint *)this & 0xffffff)) {
    pSVar2 = Array(this);
    return pSVar2 + local_14;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/compact_array.h"
             ,0x134,kFatal,(ostream *)&std::cerr);
  poVar1 = S2LogMessage::stream(&local_28);
  poVar1 = std::operator<<(poVar1,"Check failed: (n) < (size_) ");
  S2LogMessageVoidify::operator&(&local_15,poVar1);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

reference operator[](size_type n) {
    S2_DCHECK_LT(n, size_);
    return Array()[n];
  }